

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::
Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
::~Node(Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
        *this)

{
  this->_vptr_Node = (_func_int **)&PTR__Node_00197d08;
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
  ::~vector(&this->children);
  TestRunStats::~TestRunStats(&this->value);
  return;
}

Assistant:

virtual ~Node() {}